

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

int Aig_CutFilter(Aig_ManCut_t *p,Aig_Obj_t *pObj,Aig_Cut_t *pCut)

{
  int iVar1;
  int local_34;
  Aig_Cut_t *pAStack_30;
  int i;
  Aig_Cut_t *pTemp;
  Aig_Cut_t *pCut_local;
  Aig_Obj_t *pObj_local;
  Aig_ManCut_t *p_local;
  
  local_34 = 0;
  pAStack_30 = Aig_ObjCuts(p,pObj);
  do {
    if (p->nCutsMax <= local_34) {
      return 0;
    }
    if (('\x01' < pAStack_30->nFanins) && (pAStack_30 != pCut)) {
      if (pCut->nFanins < pAStack_30->nFanins) {
        if (((pAStack_30->uSign & pCut->uSign) == pCut->uSign) &&
           (iVar1 = Aig_CutCheckDominance(pCut,pAStack_30), iVar1 != 0)) {
          pAStack_30->nFanins = '\0';
        }
      }
      else if (((pAStack_30->uSign & pCut->uSign) == pAStack_30->uSign) &&
              (iVar1 = Aig_CutCheckDominance(pAStack_30,pCut), iVar1 != 0)) {
        pCut->nFanins = '\0';
        return 1;
      }
    }
    local_34 = local_34 + 1;
    pAStack_30 = Aig_CutNext(pAStack_30);
  } while( true );
}

Assistant:

int Aig_CutFilter( Aig_ManCut_t * p, Aig_Obj_t * pObj, Aig_Cut_t * pCut )
{ 
    Aig_Cut_t * pTemp;
    int i;
    // go through the cuts of the node
    Aig_ObjForEachCut( p, pObj, pTemp, i )
    {
        if ( pTemp->nFanins < 2 )
            continue;
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nFanins > pCut->nFanins )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Aig_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->nFanins = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Aig_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given
                pCut->nFanins = 0;
                return 1;
            }
        }
    }
    return 0;
}